

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

BOOL __thiscall
Js::FunctionBody::GetMatchingStatementMapFromNativeOffset
          (FunctionBody *this,DWORD_PTR codeAddress,uint32 offset,StatementData *data,uint loopNum,
          FunctionBody *inlinee)

{
  int statementIndex;
  BOOL BVar1;
  FunctionBody *this_00;
  SmallSpanSequence *pThrowSpanSequence;
  FunctionBody *pFVar2;
  
  pFVar2 = this;
  if (loopNum == 0xffffffff) {
    this_00 = (FunctionBody *)GetEntryPointFromNativeAddress(this,codeAddress);
  }
  else {
    this_00 = (FunctionBody *)GetLoopEntryPointInfoFromNativeAddress(this,codeAddress,loopNum);
  }
  if (this_00 == (FunctionBody *)0x0) {
    pThrowSpanSequence = (SmallSpanSequence *)0x0;
  }
  else {
    pThrowSpanSequence = EntryPointInfo::GetNativeThrowSpanSequence((EntryPointInfo *)this_00);
    pFVar2 = this_00;
  }
  statementIndex = GetStatementIndexFromNativeOffset(pFVar2,pThrowSpanSequence,offset);
  BVar1 = GetMatchingStatementMap(this,data,statementIndex,inlinee);
  return BVar1;
}

Assistant:

BOOL FunctionBody::GetMatchingStatementMapFromNativeOffset(DWORD_PTR codeAddress, uint32 offset, StatementData &data, uint loopNum, FunctionBody *inlinee /* = nullptr */)
    {
        EntryPointInfo * entryPoint;

        if (loopNum == -1)
        {
            entryPoint = GetEntryPointFromNativeAddress(codeAddress);
        }
        else
        {
            entryPoint = GetLoopEntryPointInfoFromNativeAddress(codeAddress, loopNum);
        }

        SmallSpanSequence *spanSequence = entryPoint ? entryPoint->GetNativeThrowSpanSequence() : nullptr;
        int statementIndex = GetStatementIndexFromNativeOffset(spanSequence, offset);

        return GetMatchingStatementMap(data, statementIndex, inlinee);
    }